

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedCharException.cpp
# Opt level: O2

void __thiscall
antlr::MismatchedCharException::MismatchedCharException(MismatchedCharException *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Mismatched char",&local_31);
  RecognitionException::RecognitionException(&this->super_RecognitionException,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_RecognitionException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__MismatchedCharException_00278378;
  BitSet::BitSet(&this->set,0x40);
  return;
}

Assistant:

MismatchedCharException::MismatchedCharException()
  : RecognitionException("Mismatched char")
{}